

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

int duckdb::History::Add(char *line,idx_t len)

{
  undefined8 *__dest;
  bool bVar1;
  int iVar2;
  char *ptr;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  long lVar6;
  char cVar7;
  
  if ((((history != (undefined8 *)0x0) ||
       (history = (undefined8 *)calloc(1,history_max_len << 3), history != (undefined8 *)0x0)) &&
      ((history_len == 0 || (iVar2 = strcmp((char *)history[history_len + -1],line), iVar2 != 0))))
     && (bVar1 = Utf8Proc::IsValid(line,len), bVar1)) {
    bVar1 = Terminal::IsMultiline();
    if (bVar1) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        cVar7 = line[lVar6];
        if (cVar7 == '\r') {
          if (line[lVar6 + 1] != '\n') goto LAB_001eda1d;
          lVar6 = lVar6 + 1;
        }
        else {
          if (cVar7 == '\0') goto LAB_001eda64;
LAB_001eda1d:
          lVar5 = lVar5 + (ulong)(cVar7 == '\n');
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    pcVar4 = strdup(line);
    pcVar3 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      do {
        cVar7 = *pcVar3;
        if ((cVar7 == '\n') || (cVar7 == '\r')) {
          *pcVar3 = ' ';
        }
        else if (cVar7 == '\0') goto LAB_001edab2;
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  }
  return 0;
LAB_001eda64:
  pcVar4 = (char *)malloc(lVar6 + lVar5 + 1);
  lVar5 = 0;
  lVar6 = 0;
  do {
    cVar7 = line[lVar5];
    if (cVar7 == '\n') {
LAB_001eda97:
      pcVar4[lVar6] = '\r';
      lVar6 = lVar6 + 1;
      cVar7 = '\n';
    }
    else if (cVar7 == '\r') {
      cVar7 = '\r';
      if (line[lVar5 + 1] == '\n') {
        lVar5 = lVar5 + 1;
        goto LAB_001eda97;
      }
    }
    else if (cVar7 == '\0') break;
    pcVar4[lVar6] = cVar7;
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
  pcVar4[lVar6] = '\0';
LAB_001edab2:
  lVar5 = history_len;
  __dest = history;
  if (history_len == history_max_len) {
    free((void *)*history);
    memmove(__dest,__dest + 1,lVar5 * 8 - 8);
    history_len = lVar5 + -1;
  }
  __dest[history_len] = pcVar4;
  history_len = history_len + 1;
  if (history_file == (char *)0x0) {
    return 1;
  }
  if (*line == '\0') {
    return 1;
  }
  __stream = fopen(history_file,"a");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s\n",line);
    fclose(__stream);
    return 1;
  }
  return 1;
}

Assistant:

int History::Add(const char *line, idx_t len) {
	char *linecopy;

	if (history_max_len == 0) {
		return 0;
	}

	/* Initialization on first call. */
	if (history == nullptr) {
		history = (char **)malloc(sizeof(char *) * history_max_len);
		if (history == nullptr) {
			return 0;
		}
		memset(history, 0, (sizeof(char *) * history_max_len));
	}

	/* Don't add duplicated lines. */
	if (history_len && !strcmp(history[history_len - 1], line)) {
		return 0;
	}

	if (!Utf8Proc::IsValid(line, len)) {
		// don't add invalid UTF8 to history
		return 0;
	}

	/* Add an heap allocated copy of the line in the history.
	 * If we reached the max length, remove the older line. */
	if (!Terminal::IsMultiline()) {
		// replace all newlines with spaces
		linecopy = strdup(line);
		if (!linecopy) {
			return 0;
		}
		for (auto ptr = linecopy; *ptr; ptr++) {
			if (*ptr == '\n' || *ptr == '\r') {
				*ptr = ' ';
			}
		}
	} else {
		// replace all '\n' with '\r\n'
		idx_t replaced_newline_count = 0;
		idx_t len;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				len++;
			} else if (line[len] == '\n') {
				replaced_newline_count++;
			}
		}
		linecopy = (char *)malloc((len + replaced_newline_count + 1) * sizeof(char));
		idx_t pos = 0;
		for (len = 0; line[len]; len++) {
			if (line[len] == '\r' && line[len + 1] == '\n') {
				// \r\n - skip past the \n
				linecopy[pos++] = '\r';
				len++;
			} else if (line[len] == '\n') {
				linecopy[pos++] = '\r';
			}
			linecopy[pos++] = line[len];
		}
		linecopy[pos] = '\0';
	}
	if (history_len == history_max_len) {
		free(history[0]);
		memmove(history, history + 1, sizeof(char *) * (history_max_len - 1));
		history_len--;
	}
	history[history_len] = linecopy;
	history_len++;
	if (history_file && strlen(line) > 0) {
		// if there is a history file that we loaded from
		// append to the history
		// this way we can recover history in case of a crash
		FILE *fp;

		fp = fopen(history_file, "a");
		if (fp == nullptr) {
			return 1;
		}
		fprintf(fp, "%s\n", line);
		fclose(fp);
	}
	return 1;
}